

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_svc_reset_temporal_layers(AV1_COMP *cpi,int is_key)

{
  int in_ESI;
  long in_RDI;
  int tl;
  int sl;
  LAYER_CONTEXT *lc;
  SVC *svc;
  undefined4 local_28;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x9d338); local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x9d33c); local_28 = local_28 + 1) {
      if (in_ESI != 0) {
        *(undefined4 *)
         (*(long *)(in_RDI + 0x9d488) +
          (long)(local_24 * *(int *)(in_RDI + 0x9d33c) + local_28) * 0x3380 + 0x3354) = 0;
      }
    }
  }
  av1_update_temporal_layer_framerate((AV1_COMP *)svc);
  av1_restore_layer_context(cpi);
  return;
}

Assistant:

void av1_svc_reset_temporal_layers(AV1_COMP *const cpi, int is_key) {
  SVC *const svc = &cpi->svc;
  LAYER_CONTEXT *lc = NULL;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      lc = &cpi->svc.layer_context[sl * svc->number_temporal_layers + tl];
      if (is_key) lc->frames_from_key_frame = 0;
    }
  }
  av1_update_temporal_layer_framerate(cpi);
  av1_restore_layer_context(cpi);
}